

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O1

void __thiscall
gmlc::libguarded::rcu_list<int,std::mutex,std::allocator<int>>::emplace_back<int&>
          (rcu_list<int,std::mutex,std::allocator<int>> *this,int *vs)

{
  rcu_list<int,std::mutex,std::allocator<int>> *prVar1;
  int iVar2;
  undefined8 *puVar3;
  rcu_list<int,std::mutex,std::allocator<int>> *prVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x18));
  if (iVar2 == 0) {
    puVar3 = (undefined8 *)operator_new(0x18);
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    *(int *)((long)puVar3 + 0x14) = *vs;
    prVar1 = *(rcu_list<int,std::mutex,std::allocator<int>> **)(this + 8);
    prVar4 = this;
    if (prVar1 != (rcu_list<int,std::mutex,std::allocator<int>> *)0x0) {
      LOCK();
      puVar3[1] = prVar1;
      UNLOCK();
      prVar4 = prVar1;
    }
    LOCK();
    *(undefined8 **)prVar4 = puVar3;
    UNLOCK();
    LOCK();
    *(undefined8 **)(this + 8) = puVar3;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x18));
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void rcu_list<T, M, Alloc>::emplace_back(Us&&... vs)
{
    std::lock_guard<M> guard(m_write_mutex);
    auto newNode =
        detail::allocate_unique<node>(m_node_alloc, std::forward<Us>(vs)...);

    node* oldTail = m_tail.load(std::memory_order_relaxed);

    if (oldTail == nullptr) {
        m_head.store(newNode.get());
        m_tail.store(newNode.release());
    } else {
        newNode->back.store(oldTail);
        oldTail->next.store(newNode.get());
        m_tail.store(newNode.release());
    }
}